

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

bool __thiscall QPDF::findEndstream(QPDF *this)

{
  bool bVar1;
  pointer pMVar2;
  element_type *peVar3;
  element_type *this_00;
  qpdf_offset_t qVar4;
  bool local_f2;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_a1;
  string local_a0;
  undefined1 local_80 [8];
  Token t;
  QPDF *this_local;
  
  t.error_message.field_2._8_8_ = this;
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &pMVar2->file);
  readToken((Token *)local_80,this,peVar3,0x14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"endobj",&local_a1);
  bVar1 = QPDFTokenizer::Token::isWord((Token *)local_80,&local_a0);
  local_f2 = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"endstream",&local_d9);
    local_f2 = QPDFTokenizer::Token::isWord((Token *)local_80,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if (local_f2 != false) {
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar2->file);
    pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    this_00 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&pMVar2->file);
    qVar4 = InputSource::getLastOffset(this_00);
    (*peVar3->_vptr_InputSource[5])(peVar3,qVar4,0);
  }
  QPDFTokenizer::Token::~Token((Token *)local_80);
  return local_f2 != false;
}

Assistant:

bool
QPDF::findEndstream()
{
    // Find endstream or endobj. Position the input at that token.
    auto t = readToken(*m->file, 20);
    if (t.isWord("endobj") || t.isWord("endstream")) {
        m->file->seek(m->file->getLastOffset(), SEEK_SET);
        return true;
    }
    return false;
}